

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_ushl_i32_aarch64(TCGContext_conflict1 *tcg_ctx,TCGv_i32 dst,TCGv_i32 src,TCGv_i32 shift)

{
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 ret_02;
  TCGv_i32 v2;
  TCGv_i32 c2;
  uintptr_t o_1;
  uintptr_t o_5;
  uintptr_t o_2;
  uintptr_t o;
  uintptr_t o_3;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  ret_01 = tcg_temp_new_i32(tcg_ctx);
  ret_02 = tcg_temp_new_i32(tcg_ctx);
  v2 = tcg_const_i32_aarch64(tcg_ctx,0);
  c2 = tcg_const_i32_aarch64(tcg_ctx,0x20);
  tcg_gen_ext8s_i32_aarch64(tcg_ctx,ret_01,shift);
  tcg_gen_neg_i32(tcg_ctx,ret_02,ret_01);
  tcg_gen_shl_i32(tcg_ctx,ret,src,ret_01);
  tcg_gen_shr_i32(tcg_ctx,ret_00,src,ret_02);
  tcg_gen_movcond_i32_aarch64(tcg_ctx,TCG_COND_LTU,dst,ret_01,c2,ret,v2);
  tcg_gen_movcond_i32_aarch64(tcg_ctx,TCG_COND_LTU,dst,ret_02,c2,ret_00,dst);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_02 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v2 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  return;
}

Assistant:

void gen_ushl_i32(TCGContext *tcg_ctx, TCGv_i32 dst, TCGv_i32 src, TCGv_i32 shift)
{
    TCGv_i32 lval = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 rval = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 lsh = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 rsh = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 zero = tcg_const_i32(tcg_ctx, 0);
    TCGv_i32 max = tcg_const_i32(tcg_ctx, 32);

    /*
     * Rely on the TCG guarantee that out of range shifts produce
     * unspecified results, not undefined behaviour (i.e. no trap).
     * Discard out-of-range results after the fact.
     */
    tcg_gen_ext8s_i32(tcg_ctx, lsh, shift);
    tcg_gen_neg_i32(tcg_ctx, rsh, lsh);
    tcg_gen_shl_i32(tcg_ctx, lval, src, lsh);
    tcg_gen_shr_i32(tcg_ctx, rval, src, rsh);
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LTU, dst, lsh, max, lval, zero);
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LTU, dst, rsh, max, rval, dst);

    tcg_temp_free_i32(tcg_ctx, lval);
    tcg_temp_free_i32(tcg_ctx, rval);
    tcg_temp_free_i32(tcg_ctx, lsh);
    tcg_temp_free_i32(tcg_ctx, rsh);
    tcg_temp_free_i32(tcg_ctx, zero);
    tcg_temp_free_i32(tcg_ctx, max);
}